

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_sx_sy_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  ulong in_RSI;
  ulong uVar1;
  void *in_RDI;
  ulong in_R8;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i v_val_w;
  void *in_stack_00000008;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i v_m0_w;
  __m128i v_rs_w;
  __m128i v_r1_s_w;
  __m128i v_r0_s_w;
  __m128i v_r_s_b;
  __m128i v_rvs_b;
  __m128i v_rb_b;
  __m128i v_ra_b;
  __m128i _r;
  __m128i v_maxval_b;
  __m128i v_shuffle_b;
  ulong local_138;
  void *local_118;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  undefined8 local_48;
  undefined8 local_38;
  
  uVar1 = in_RSI;
  xx_loadu_128("");
  local_138 = in_R8;
  local_118 = in_RDI;
  do {
    xx_loadl_64(in_stack_00000008);
    alVar4 = xx_loadl_64((void *)((long)in_stack_00000008 + (ulong)(uint)v_res_b[0]));
    local_78 = (char)extraout_XMM0_Qa_00;
    cStack_77 = (char)((ulong)extraout_XMM0_Qa_00 >> 8);
    cStack_76 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    cStack_75 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x18);
    cStack_74 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    cStack_73 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x28);
    cStack_72 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    cStack_71 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x38);
    cStack_70 = (char)extraout_XMM0_Qb_00;
    cStack_6f = (char)((ulong)extraout_XMM0_Qb_00 >> 8);
    cStack_6e = (char)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    cStack_6d = (char)((ulong)extraout_XMM0_Qb_00 >> 0x18);
    cStack_6c = (char)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    cStack_6b = (char)((ulong)extraout_XMM0_Qb_00 >> 0x28);
    cStack_6a = (char)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    cStack_69 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x38);
    local_88 = (char)extraout_XMM0_Qa_01;
    cStack_87 = (char)((ulong)extraout_XMM0_Qa_01 >> 8);
    cStack_86 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x10);
    cStack_85 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x18);
    cStack_84 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    cStack_83 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x28);
    cStack_82 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x30);
    cStack_81 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x38);
    cStack_80 = (char)extraout_XMM0_Qb_01;
    cStack_7f = (char)((ulong)extraout_XMM0_Qb_01 >> 8);
    cStack_7e = (char)((ulong)extraout_XMM0_Qb_01 >> 0x10);
    cStack_7d = (char)((ulong)extraout_XMM0_Qb_01 >> 0x18);
    cStack_7c = (char)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    cStack_7b = (char)((ulong)extraout_XMM0_Qb_01 >> 0x28);
    cStack_7a = (char)((ulong)extraout_XMM0_Qb_01 >> 0x30);
    cStack_79 = (char)((ulong)extraout_XMM0_Qb_01 >> 0x38);
    auVar3[1] = cStack_77 + cStack_87;
    auVar3[0] = local_78 + local_88;
    auVar3[2] = cStack_76 + cStack_86;
    auVar3[3] = cStack_75 + cStack_85;
    auVar3[4] = cStack_74 + cStack_84;
    auVar3[5] = cStack_73 + cStack_83;
    auVar3[6] = cStack_72 + cStack_82;
    auVar3[7] = cStack_71 + cStack_81;
    auVar3[9] = cStack_6f + cStack_7f;
    auVar3[8] = cStack_70 + cStack_80;
    auVar3[10] = cStack_6e + cStack_7e;
    auVar3[0xb] = cStack_6d + cStack_7d;
    auVar3[0xc] = cStack_6c + cStack_7c;
    auVar3[0xd] = cStack_6b + cStack_7b;
    auVar3[0xe] = cStack_6a + cStack_7a;
    auVar3[0xf] = cStack_69 + cStack_79;
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar2._0_8_ = extraout_XMM0_Qa;
    auVar2 = pshufb(auVar3,auVar2);
    local_38 = auVar2._0_8_;
    auVar3 = pmovzxbw(auVar2,local_38);
    local_48 = auVar2._8_8_;
    auVar2 = pmovzxbw(auVar2 >> 0x40,local_48);
    local_58 = auVar3._0_2_;
    sStack_56 = auVar3._2_2_;
    sStack_54 = auVar3._4_2_;
    sStack_52 = auVar3._6_2_;
    sStack_50 = auVar3._8_2_;
    sStack_4e = auVar3._10_2_;
    sStack_4c = auVar3._12_2_;
    sStack_4a = auVar3._14_2_;
    local_68 = auVar2._0_2_;
    sStack_66 = auVar2._2_2_;
    sStack_64 = auVar2._4_2_;
    sStack_62 = auVar2._6_2_;
    sStack_60 = auVar2._8_2_;
    sStack_5e = auVar2._10_2_;
    sStack_5c = auVar2._12_2_;
    sStack_5a = auVar2._14_2_;
    local_58 = local_58 + local_68;
    sStack_56 = sStack_56 + sStack_66;
    sStack_54 = sStack_54 + sStack_64;
    sStack_52 = sStack_52 + sStack_62;
    sStack_50 = sStack_50 + sStack_60;
    sStack_4e = sStack_4e + sStack_5e;
    sStack_4c = sStack_4c + sStack_5c;
    sStack_4a = sStack_4a + sStack_5a;
    v_val_w[1] = uVar1;
    v_val_w[0] = 2;
    xx_roundn_epu16(v_val_w,(int)alVar4[1]);
    uVar1 = local_138;
    alVar4 = blend_4_u8(auVar3._0_8_,auVar2._8_8_,auVar2._0_8_,
                        (__m128i *)
                        CONCAT26(sStack_4a,CONCAT24(sStack_4c,CONCAT22(sStack_4e,sStack_50))),
                        (__m128i *)
                        CONCAT26(sStack_52,CONCAT24(sStack_54,CONCAT22(sStack_56,local_58))));
    alVar4[0] = uVar1;
    xx_storel_32(local_118,alVar4);
    local_118 = (void *)((long)local_118 + (in_RSI & 0xffffffff));
    local_138 = local_138 + in_R9D;
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)((uint)v_res_b[0] << 1));
    v_m1_b[0]._0_4_ = (int)v_m1_b[0] + -1;
  } while ((int)v_m1_b[0] != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_sy_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  (void)w;

  do {
    const __m128i v_ra_b = xx_loadl_64(mask);
    const __m128i v_rb_b = xx_loadl_64(mask + mask_stride);
    const __m128i v_rvs_b = _mm_add_epi8(v_ra_b, v_rb_b);
    const __m128i v_r_s_b = _mm_shuffle_epi8(v_rvs_b, v_shuffle_b);
    const __m128i v_r0_s_w = _mm_cvtepu8_epi16(v_r_s_b);
    const __m128i v_r1_s_w = _mm_cvtepu8_epi16(_mm_srli_si128(v_r_s_b, 8));
    const __m128i v_rs_w = _mm_add_epi16(v_r0_s_w, v_r1_s_w);
    const __m128i v_m0_w = xx_roundn_epu16(v_rs_w, 2);
    const __m128i v_m0_b = _mm_packus_epi16(v_m0_w, v_m0_w);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

    const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

    xx_storel_32(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}